

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

mir_size_t var_align(c2m_ctx_t c2m_ctx,type *type)

{
  int iVar1;
  mir_size_t mVar2;
  
  raw_type_size(c2m_ctx,type);
  iVar1 = type->align;
  if ((long)iVar1 < 0) {
    __assert_fail("align >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x17da,"mir_size_t var_align(c2m_ctx_t, struct type *)");
  }
  if ((type->mode == TM_ARR) && (mVar2 = raw_type_size(c2m_ctx,type), 0xf < mVar2)) {
    return 0x10;
  }
  return (long)iVar1;
}

Assistant:

static mir_size_t var_align (c2m_ctx_t c2m_ctx, struct type *type) {
  int align;

  raw_type_size (c2m_ctx, type); /* check */
  align = type->align;
  assert (align >= 0);
#ifdef ADJUST_VAR_ALIGNMENT
  align = ADJUST_VAR_ALIGNMENT (c2m_ctx, align, type);
#endif
  return align;
}